

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
CustomUintFormatter<8,false>::
Unser<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,ServiceFlags>
          (CustomUintFormatter<8,false> *this,
          ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *s,ServiceFlags *v)

{
  HashVerifier<DataStream> *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  ServiceFlags local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = NODE_NONE;
  this_00 = s->m_substream;
  DataStream::read(this_00->m_source,(int)&local_28,&DAT_00000008,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)&local_28,8);
  *v = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }